

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.hpp
# Opt level: O2

void __thiscall
gl4cts::SparseTexture2LookupTestCase::FunctionToken::FunctionToken
          (FunctionToken *this,string *fname,string *fargs)

{
  _Rb_tree_header *p_Var1;
  
  std::__cxx11::string::string((string *)this,(string *)fname);
  std::__cxx11::string::string((string *)&this->arguments,(string *)fargs);
  p_Var1 = &(this->allowedTargets)._M_t._M_impl.super__Rb_tree_header;
  (this->allowedTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->allowedTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->allowedTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->allowedTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->allowedTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

FunctionToken(std::string fname, std::string fargs) : name(fname), arguments(fargs)
		{
		}